

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O1

double __thiscall
Problem_CGBG_FF::ComputeLocalProbability
          (Problem_CGBG_FF *this,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  _Rb_tree_header *__position;
  pointer pvVar1;
  uint *puVar2;
  pointer puVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  uint *__v;
  ulong uVar6;
  _Self __tmp;
  ulong uVar7;
  double dVar8;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> house_scope;
  double local_88;
  _Alloc_node local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  __position = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar7 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar3 = (tupleOfAgents->super_SDT).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  if ((tupleOfAgents->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    do {
      uVar6 = (ulong)puVar3[uVar7];
      pvVar1 = (this->_m_houseIndices_obs).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->_m_houseIndices_obs).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x5555555555555555;
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      puVar2 = *(pointer *)
                ((long)&pvVar1[uVar6].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8);
      local_68._M_t = &local_60;
      for (__v = pvVar1[uVar6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start; __v != puVar2; __v = __v + 1) {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::
        _M_insert_unique_<unsigned_int_const&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_60,(const_iterator)__position,__v,&local_68);
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      puVar3 = (tupleOfAgents->super_SDT).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(tupleOfAgents->super_SDT).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2));
  }
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == __position) {
    local_88 = 1.0;
  }
  else {
    local_88 = 1.0;
    p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      dVar8 = ComputeHouseProbability(this,p_Var4[1]._M_color,tupleOfAgents,types);
      local_88 = local_88 * dVar8;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != __position);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return local_88;
}

Assistant:

double Problem_CGBG_FF::ComputeLocalProbability( 
        const Scope& tupleOfAgents,
        const vector<Index>& types
        ) const
{

    /* Let
        - si denote the fire level of house i
        - hi denote the observation of house i (by some agent left unspecified here)

       Given that 
        1) the fire levels at different houses are independent P(s)=P(s1)*...*P(sN),
        2) the observation made of different houses are independent: P(h1h2|s)=P(h1|s1)P(h2|s2)
        the following should work.
      
       assume 2 agents that observe 2 houses each:
        -agent 1 gets observations of houses 1 and 2: t1=<h1,h2>
        -agent 2 gets observations of houses 2 and 3: t2=<h2,h3>
       
       Then P(t1,t2)
        = \sum_s P(t1|s)P(t2|s)P(s)
        = \sum_{s1} \sum_{s2} \sum_{s3} [ P(h1|s1)P(h2|s2) ] * [ P(h2|s2)P(h3|s3) ] * P(s1)P(s2)P(s3)
        = [sum_{s1} P(h1|s1) P(s1)] * [sum_{s2} P(h2|s2)P(h2|s2)P(s2)] * [sum_{s3} P(h3|s3) P(s3)]

       So we can compute the probability of a joint type, as the product of a term for each house
       in the `observation scope':
          ComputeHouseProbability(h1, observations_for_h1) * 
          ComputeHouseProbability(h2, observations_for_h2) * 
          ComputeHouseProbability(h3, observations_for_h3)  
    */

    //first we detemine the houses that are 'in scope'
    std::set<Index> house_scope;
    for(Index i=0; i < tupleOfAgents.size(); i++)
    {
        Index agI = tupleOfAgents.at(i);
        const vector<Index> & obsHouseIndices = _m_houseIndices_obs.at(agI);
        house_scope.insert(obsHouseIndices.begin(), obsHouseIndices.end());
#if DEBUGPROBS
        cout << "Agent " << agI << " observes houses " << PrintTools::SoftPrintVector(obsHouseIndices) << endl;
#endif
    }
#if DEBUGPROBS
    cout << "'Combined houses scope' = " << PrintTools::SoftPrintSet(house_scope) << endl;
    cout << "Computing probability term (e.g. [sum_{s2} P(h2|s2)P(h2|s2)P(s2)] ) for each house..."<<endl;
#endif
    //for each house:
    std::set<Index>::iterator it =  house_scope.begin();
    std::set<Index>::iterator last =  house_scope.end();
    double p = 1.0;
    while (it != last)
    {
        Index hI = *it;
#if DEBUGPROBS
        cout << "house " << hI << "..."<<endl;
#endif
        double phI = ComputeHouseProbability(hI, tupleOfAgents, types);
#if DEBUGPROBS
        cout << "...house " << hI << " probability term, P(h_obs,h_obs) = " << phI << endl;
#endif
        p *= phI;
        it++;
    }
    return p;
}